

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_Plugin_SourceFileDescriptors_Test::TestBody
          (CommandLineInterfaceTest_Plugin_SourceFileDescriptors_Test *this)

{
  string_view contents;
  bool bVar1;
  char *pcVar2;
  FileDescriptorProto *pFVar3;
  string *lhs;
  DescriptorProto_ExtensionRange *this_00;
  ExtensionRangeOptions *this_01;
  char *in_R9;
  string_view src;
  AssertHelper local_348;
  Message local_340;
  int local_338;
  int local_334;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_4;
  Message local_318;
  int local_310;
  int local_30c;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_3;
  DescriptorProto *m;
  Message local_2e8;
  int local_2e0;
  int local_2dc;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_2;
  Message local_2c0;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_1;
  Message local_2a0;
  int local_298;
  int local_294;
  undefined1 local_290 [8];
  AssertionResult gtest_ar;
  AssertHelper local_260;
  Message local_258;
  string_view local_250;
  bool local_239;
  undefined1 local_238 [8];
  AssertionResult gtest_ar__1;
  CodeGeneratorRequest request;
  string local_1b0;
  AssertHelper local_190;
  Message local_188;
  undefined1 local_180 [16];
  bool local_169;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_;
  string binary_request;
  undefined1 local_128 [8];
  string base64_output;
  AlphaNum local_d8;
  string local_a8;
  allocator<char> local_71;
  undefined1 local_70 [8];
  string plugin_path;
  char *local_48;
  string_view local_40;
  string_view local_30;
  string_view local_20;
  CommandLineInterfaceTest_Plugin_SourceFileDescriptors_Test *local_10;
  CommandLineInterfaceTest_Plugin_SourceFileDescriptors_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"foo.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,
             "syntax = \"proto2\"\n                      ;\n                      import \"bar.proto\";\n                      package foo;\n                      message Foo {\n                        optional bar.Bar b = 1;\n                        extensions 1000 to max [\n                          declaration = {\n                            number: 1000\n                            full_name: \".foo.my_ext\"\n                            type: \".foo.MyType\"\n                          }\n                        ];\n                      }"
            );
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_20,local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"bar.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&plugin_path.field_2 + 8),
             "syntax = \"proto2\"\n                      ;\n                      package bar;\n                      message Bar {\n                        extensions 1000 to max [\n                          declaration = {\n                            number: 1000\n                            full_name: \".baz.my_ext\"\n                            type: \".baz.MyType\"\n                          }\n                        ];\n                      }"
            );
  contents._M_str = local_48;
  contents._M_len = plugin_path.field_2._8_8_;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_40,contents);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/fake_plugin"
             ,&local_71);
  std::allocator<char>::~allocator(&local_71);
  absl::lts_20250127::AlphaNum::AlphaNum
            (&local_d8,
             "protocol_compiler --fake_plugin_out=$tmpdir --proto_path=$tmpdir foo.proto --plugin=prefix-gen-fake_plugin="
            );
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
            ((AlphaNum *)((long)&base64_output.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_a8,(lts_20250127 *)&local_d8,(AlphaNum *)((long)&base64_output.field_2 + 8),
             (AlphaNum *)plugin_path.field_2._8_8_);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&binary_request.field_2 + 8)
             ,"foo.proto.request");
  compiler::(anonymous_namespace)::CommandLineInterfaceTest::ReadFile_abi_cxx11_
            ((string *)local_128,this,stack0xfffffffffffffec8);
  std::__cxx11::string::string((string *)&gtest_ar_.message_);
  local_180 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_128);
  src._M_str = (char *)&gtest_ar_.message_;
  src._M_len = local_180._8_8_;
  local_169 = absl::lts_20250127::Base64Unescape
                        (local_180._0_8_,src,(Nonnull<std::string_*>)local_180._0_8_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_168,&local_169,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1b0,(internal *)local_168,
               (AssertionResult *)"absl::Base64Unescape(base64_output, &binary_request)","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
               ,0x227,pcVar2);
    testing::internal::AssertHelper::operator=(&local_190,&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  if (bVar1) {
    CodeGeneratorRequest::CodeGeneratorRequest((CodeGeneratorRequest *)&gtest_ar__1.message_);
    local_250 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)&gtest_ar_.message_);
    local_239 = protobuf::MessageLite::ParseFromString
                          ((MessageLite *)&gtest_ar__1.message_,local_250);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_238,&local_239,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
    if (!bVar1) {
      testing::Message::Message(&local_258);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar.message_,(internal *)local_238,
                 (AssertionResult *)"request.ParseFromString(binary_request)","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_260,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x229,pcVar2);
      testing::internal::AssertHelper::operator=(&local_260,&local_258);
      testing::internal::AssertHelper::~AssertHelper(&local_260);
      std::__cxx11::string::~string((string *)&gtest_ar.message_);
      testing::Message::~Message(&local_258);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
    if (bVar1) {
      local_294 = CodeGeneratorRequest::source_file_descriptors_size
                            ((CodeGeneratorRequest *)&gtest_ar__1.message_);
      local_298 = 1;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_290,"request.source_file_descriptors_size()","1",&local_294,
                 &local_298);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
      if (!bVar1) {
        testing::Message::Message(&local_2a0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                   ,0x22d,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_2a0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_2a0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
      if (bVar1) {
        pFVar3 = CodeGeneratorRequest::source_file_descriptors
                           ((CodeGeneratorRequest *)&gtest_ar__1.message_,0);
        lhs = FileDescriptorProto::name_abi_cxx11_(pFVar3);
        testing::internal::EqHelper::
        Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_nullptr>
                  ((EqHelper *)local_2b8,"request.source_file_descriptors(0).name()","\"foo.proto\""
                   ,lhs,(char (*) [10])0x1e1d402);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
        if (!bVar1) {
          testing::Message::Message(&local_2c0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                     ,0x22e,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_2.message_,&local_2c0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
          testing::Message::~Message(&local_2c0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
        pFVar3 = CodeGeneratorRequest::source_file_descriptors
                           ((CodeGeneratorRequest *)&gtest_ar__1.message_,0);
        local_2dc = FileDescriptorProto::message_type_size(pFVar3);
        local_2e0 = 1;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_2d8,"request.source_file_descriptors(0).message_type_size()",
                   "1",&local_2dc,&local_2e0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
        if (!bVar1) {
          testing::Message::Message(&local_2e8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&m,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                     ,0x22f,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&m,&local_2e8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m);
          testing::Message::~Message(&local_2e8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
        if (bVar1) {
          pFVar3 = CodeGeneratorRequest::source_file_descriptors
                             ((CodeGeneratorRequest *)&gtest_ar__1.message_,0);
          gtest_ar_3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )FileDescriptorProto::message_type(pFVar3,0);
          local_30c = DescriptorProto::extension_range_size
                                ((DescriptorProto *)
                                 gtest_ar_3.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl);
          local_310 = 1;
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_308,"m.extension_range_size()","1",&local_30c,&local_310);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
          if (!bVar1) {
            testing::Message::Message(&local_318);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                       ,0x231,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_4.message_,&local_318);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
            testing::Message::~Message(&local_318);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
          if (bVar1) {
            this_00 = DescriptorProto::extension_range
                                ((DescriptorProto *)
                                 gtest_ar_3.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl,0);
            this_01 = DescriptorProto_ExtensionRange::options(this_00);
            local_334 = ExtensionRangeOptions::declaration_size(this_01);
            local_338 = 1;
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_330,"m.extension_range(0).options().declaration_size()","1"
                       ,&local_334,&local_338);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
            if (!bVar1) {
              testing::Message::Message(&local_340);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
              testing::internal::AssertHelper::AssertHelper
                        (&local_348,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                         ,0x232,pcVar2);
              testing::internal::AssertHelper::operator=(&local_348,&local_340);
              testing::internal::AssertHelper::~AssertHelper(&local_348);
              testing::Message::~Message(&local_340);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
          }
        }
      }
    }
    CodeGeneratorRequest::~CodeGeneratorRequest((CodeGeneratorRequest *)&gtest_ar__1.message_);
  }
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)local_128);
  std::__cxx11::string::~string((string *)local_70);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, Plugin_SourceFileDescriptors) {
  CreateTempFile("foo.proto",
                 R"pb(syntax = "proto2"
                      ;
                      import "bar.proto";
                      package foo;
                      message Foo {
                        optional bar.Bar b = 1;
                        extensions 1000 to max [
                          declaration = {
                            number: 1000
                            full_name: ".foo.my_ext"
                            type: ".foo.MyType"
                          }
                        ];
                      })pb");
  CreateTempFile("bar.proto",
                 R"pb(syntax = "proto2"
                      ;
                      package bar;
                      message Bar {
                        extensions 1000 to max [
                          declaration = {
                            number: 1000
                            full_name: ".baz.my_ext"
                            type: ".baz.MyType"
                          }
                        ];
                      })pb");

#ifdef GOOGLE_PROTOBUF_FAKE_PLUGIN_PATH
  std::string plugin_path = GOOGLE_PROTOBUF_FAKE_PLUGIN_PATH;
#else
  std::string plugin_path = absl::StrCat(
      TestUtil::TestSourceDir(), "/google/protobuf/compiler/fake_plugin");
#endif

  // Invoke protoc with fake_plugin to get ahold of the CodeGeneratorRequest
  // sent by protoc.
  Run(absl::StrCat(
      "protocol_compiler --fake_plugin_out=$tmpdir --proto_path=$tmpdir "
      "foo.proto --plugin=prefix-gen-fake_plugin=",
      plugin_path));
  ExpectNoErrors();
  std::string base64_output = ReadFile("foo.proto.request");
  std::string binary_request;
  ASSERT_TRUE(absl::Base64Unescape(base64_output, &binary_request));
  CodeGeneratorRequest request;
  ASSERT_TRUE(request.ParseFromString(binary_request));

  // request.source_file_descriptors() should consist of a descriptor for
  // foo.proto that includes source-retention options.
  ASSERT_EQ(request.source_file_descriptors_size(), 1);
  EXPECT_EQ(request.source_file_descriptors(0).name(), "foo.proto");
  ASSERT_EQ(request.source_file_descriptors(0).message_type_size(), 1);
  const DescriptorProto& m = request.source_file_descriptors(0).message_type(0);
  ASSERT_EQ(m.extension_range_size(), 1);
  EXPECT_EQ(m.extension_range(0).options().declaration_size(), 1);
}